

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void pegmatite::_syntax_Error(ErrorReporter *err,Context *con)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ParserPosition r;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ParserPosition local_68;
  InputRange local_48;
  
  local_68.it.buffer = (con->error_pos).it.buffer;
  uVar1 = (con->error_pos).line;
  uVar2 = (con->error_pos).col;
  local_68.it.idx = (con->error_pos).it.idx + 1;
  local_68.col = uVar2 + 1;
  local_68.line = uVar1;
  InputRange::InputRange(&local_48,&con->error_pos,&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"syntax error",&local_89);
  std::
  function<void_(const_pegmatite::InputRange_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(err,&local_48,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

static void _syntax_Error(ErrorReporter &err, Context &con)
{
	err(InputRange(con.error_pos, _next_pos(con.error_pos)), "syntax error");
}